

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprAnalyzeOrTerm(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  WhereInfo *pWInfo_00;
  Parse *pParse_00;
  sqlite3 *db_00;
  Expr *pExpr_00;
  bool bVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  WhereOrInfo *pWC_00;
  WhereClause *pWC_01;
  WhereTerm *pWVar5;
  WhereTerm *pTwo_00;
  Bitmask BVar6;
  Expr *pEVar7;
  int idxNew;
  Expr *pNew;
  Expr *pLeft_1;
  ExprList *pList;
  Expr *pDup;
  int affRight;
  int affLeft;
  Expr *pLeft;
  int j_1;
  int iCursor;
  int iColumn;
  int okToChngToIN;
  WhereTerm *pTwo;
  int iTwo;
  WhereTerm *pOne;
  int iOne;
  WhereTerm *pOther;
  Bitmask b_1;
  Bitmask b;
  WhereTerm *pWStack_90;
  int j;
  WhereTerm *pAndTerm;
  WhereClause *pAndWC;
  WhereAndInfo *pAndInfo;
  Bitmask indexable;
  Bitmask chngToIN;
  WhereOrInfo *pOrInfo;
  WhereTerm *pOrTerm;
  WhereClause *pOrWc;
  int i;
  Expr *pExpr;
  WhereTerm *pTerm;
  sqlite3 *db;
  Parse *pParse;
  WhereInfo *pWInfo;
  int idxTerm_local;
  WhereClause *pWC_local;
  SrcList *pSrc_local;
  
  pWInfo_00 = pWC->pWInfo;
  pParse_00 = pWInfo_00->pParse;
  db_00 = pParse_00->db;
  pWVar5 = pWC->a + idxTerm;
  pExpr_00 = pWVar5->pExpr;
  pWC_00 = (WhereOrInfo *)sqlite3DbMallocZero(db_00,0x230);
  (pWVar5->u).pOrInfo = pWC_00;
  if (pWC_00 != (WhereOrInfo *)0x0) {
    pWVar5->wtFlags = pWVar5->wtFlags | 0x10;
    memset((pWC_00->wc).aStatic,0,0x200);
    sqlite3WhereClauseInit((WhereClause *)pWC_00,pWInfo_00);
    sqlite3WhereSplit((WhereClause *)pWC_00,pExpr_00,'+');
    sqlite3WhereExprAnalyze(pSrc,(WhereClause *)pWC_00);
    if (db_00->mallocFailed == '\0') {
      pAndInfo = (WhereAndInfo *)0xffffffffffffffff;
      indexable = 0xffffffffffffffff;
      pOrWc._4_4_ = (pWC_00->wc).nTerm;
      pOrInfo = (WhereOrInfo *)(pWC_00->wc).a;
      while (pOrWc._4_4_ = pOrWc._4_4_ + -1, -1 < pOrWc._4_4_ && pAndInfo != (WhereAndInfo *)0x0) {
        if (((pOrInfo->wc).nTerm & 0x1ff) == 0) {
          indexable = 0;
          pWC_01 = (WhereClause *)sqlite3DbMallocRawNN(db_00,0x228);
          if (pWC_01 != (WhereClause *)0x0) {
            b_1 = 0;
            (pOrInfo->wc).aStatic[0].pExpr = (Expr *)pWC_01;
            *(ushort *)&(pOrInfo->wc).field_0x12 = *(ushort *)&(pOrInfo->wc).field_0x12 | 0x20;
            *(undefined2 *)&(pOrInfo->wc).nTerm = 0x400;
            memset(pWC_01->aStatic,0,0x200);
            sqlite3WhereClauseInit(pWC_01,pWC->pWInfo);
            sqlite3WhereSplit(pWC_01,(Expr *)(pOrInfo->wc).pWInfo,',');
            sqlite3WhereExprAnalyze(pSrc,pWC_01);
            pWC_01->pOuter = pWC;
            if (db_00->mallocFailed == '\0') {
              b._4_4_ = 0;
              pWStack_90 = pWC_01->a;
              for (; b._4_4_ < pWC_01->nTerm; b._4_4_ = b._4_4_ + 1) {
                iVar4 = allowedOp((uint)pWStack_90->pExpr->op);
                if ((iVar4 != 0) || (pWStack_90->eOperator == 0x40)) {
                  BVar6 = sqlite3WhereGetMask(&pWInfo_00->sMaskSet,pWStack_90->leftCursor);
                  b_1 = BVar6 | b_1;
                }
                pWStack_90 = pWStack_90 + 1;
              }
            }
            pAndInfo = (WhereAndInfo *)(b_1 & (ulong)pAndInfo);
          }
        }
        else if ((*(ushort *)&(pOrInfo->wc).field_0x12 & 8) == 0) {
          pOther = (WhereTerm *)
                   sqlite3WhereGetMask(&pWInfo_00->sMaskSet,*(int *)&(pOrInfo->wc).field_0x1c);
          if ((*(ushort *)&(pOrInfo->wc).field_0x12 & 2) != 0) {
            BVar6 = sqlite3WhereGetMask(&pWInfo_00->sMaskSet,
                                        (pWC_00->wc).a[(pOrInfo->wc).nSlot].leftCursor);
            pOther = (WhereTerm *)(BVar6 | (ulong)pOther);
          }
          pAndInfo = (WhereAndInfo *)((ulong)pOther & (ulong)pAndInfo);
          if (((pOrInfo->wc).nTerm & 2) == 0) {
            indexable = 0;
          }
          else {
            indexable = (ulong)pOther & indexable;
          }
        }
        pOrInfo = (WhereOrInfo *)&(pOrInfo->wc).aStatic[0].iParent;
      }
      pWC_00->indexable = (Bitmask)pAndInfo;
      if (pAndInfo == (WhereAndInfo *)0x0) {
        pWVar5->eOperator = 0x200;
      }
      else {
        pWVar5->eOperator = 0x200;
        pWC->hasOr = '\x01';
        if ((pWC_00->wc).nTerm == 2) {
          pOne._4_4_ = 0;
          while( true ) {
            iVar4 = pOne._4_4_ + 1;
            pWVar5 = whereNthSubterm((pWC_00->wc).a,pOne._4_4_);
            if (pWVar5 == (WhereTerm *)0x0) break;
            pTwo._4_4_ = 0;
            while( true ) {
              pTwo_00 = whereNthSubterm((pWC_00->wc).a + 1,pTwo._4_4_);
              pOne._4_4_ = iVar4;
              if (pTwo_00 == (WhereTerm *)0x0) break;
              whereCombineDisjuncts(pSrc,pWC,pWVar5,pTwo_00);
              pTwo._4_4_ = pTwo._4_4_ + 1;
            }
          }
        }
      }
      if (indexable != 0) {
        bVar1 = false;
        j_1 = -1;
        pLeft._4_4_ = -1;
        for (pLeft._0_4_ = 0; (int)pLeft < 2 && !bVar1; pLeft._0_4_ = (int)pLeft + 1) {
          _affRight = (Expr *)0x0;
          pOrInfo = (WhereOrInfo *)(pWC_00->wc).a;
          pOrWc._4_4_ = (pWC_00->wc).nTerm;
          while (pOrWc._4_4_ = pOrWc._4_4_ + -1, -1 < pOrWc._4_4_) {
            *(ushort *)&(pOrInfo->wc).field_0x12 = *(ushort *)&(pOrInfo->wc).field_0x12 & 0xffbf;
            if ((*(int *)&(pOrInfo->wc).field_0x1c != pLeft._4_4_) &&
               (BVar6 = sqlite3WhereGetMask(&pWInfo_00->sMaskSet,*(int *)&(pOrInfo->wc).field_0x1c),
               (indexable & BVar6) != 0)) {
              j_1 = *(int *)&(pOrInfo->wc).aStatic[0].pExpr;
              pLeft._4_4_ = *(int *)&(pOrInfo->wc).field_0x1c;
              _affRight = (Expr *)((pOrInfo->wc).pWInfo)->pOrderBy;
              break;
            }
            pOrInfo = (WhereOrInfo *)&(pOrInfo->wc).aStatic[0].iParent;
          }
          if (pOrWc._4_4_ < 0) break;
          bVar1 = true;
          for (; -1 < pOrWc._4_4_ && bVar1; pOrWc._4_4_ = pOrWc._4_4_ + -1) {
            if (*(int *)&(pOrInfo->wc).field_0x1c == pLeft._4_4_) {
              if ((*(int *)&(pOrInfo->wc).aStatic[0].pExpr == j_1) &&
                 ((j_1 != -2 ||
                  (iVar4 = sqlite3ExprCompare(pParse_00,(Expr *)((pOrInfo->wc).pWInfo)->pOrderBy,
                                              _affRight,-1), iVar4 == 0)))) {
                cVar2 = sqlite3ExprAffinity((Expr *)((pOrInfo->wc).pWInfo)->pResultSet);
                cVar3 = sqlite3ExprAffinity((Expr *)((pOrInfo->wc).pWInfo)->pOrderBy);
                if ((cVar2 == '\0') || (cVar2 == cVar3)) {
                  *(ushort *)&(pOrInfo->wc).field_0x12 = *(ushort *)&(pOrInfo->wc).field_0x12 | 0x40
                  ;
                }
                else {
                  bVar1 = false;
                }
              }
              else {
                bVar1 = false;
              }
            }
            else {
              *(ushort *)&(pOrInfo->wc).field_0x12 = *(ushort *)&(pOrInfo->wc).field_0x12 & 0xffbf;
            }
            pOrInfo = (WhereOrInfo *)&(pOrInfo->wc).aStatic[0].iParent;
          }
        }
        if (bVar1) {
          pLeft_1 = (Expr *)0x0;
          pNew = (Expr *)0x0;
          pOrWc._4_4_ = (pWC_00->wc).nTerm;
          pOrInfo = (WhereOrInfo *)(pWC_00->wc).a;
          while (pOrWc._4_4_ = pOrWc._4_4_ + -1, -1 < pOrWc._4_4_) {
            if ((*(ushort *)&(pOrInfo->wc).field_0x12 & 0x40) != 0) {
              pEVar7 = sqlite3ExprDup(db_00,(Expr *)((pOrInfo->wc).pWInfo)->pResultSet,0);
              pLeft_1 = (Expr *)sqlite3ExprListAppend(pWInfo_00->pParse,(ExprList *)pLeft_1,pEVar7);
              pNew = (Expr *)((pOrInfo->wc).pWInfo)->pOrderBy;
            }
            pOrInfo = (WhereOrInfo *)&(pOrInfo->wc).aStatic[0].iParent;
          }
          pEVar7 = sqlite3ExprDup(db_00,pNew,0);
          pEVar7 = sqlite3PExpr(pParse_00,0x31,pEVar7,(Expr *)0x0);
          if (pEVar7 == (Expr *)0x0) {
            sqlite3ExprListDelete(db_00,(ExprList *)pLeft_1);
          }
          else {
            transferJoinMarkings(pEVar7,pExpr_00);
            (pEVar7->x).pList = (ExprList *)pLeft_1;
            iVar4 = whereClauseInsert(pWC,pEVar7,3);
            exprAnalyze(pSrc,pWC,iVar4);
            markTermAsChild(pWC,iVar4,idxTerm);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void exprAnalyzeOrTerm(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the complete WHERE clause */
  int idxTerm               /* Index of the OR-term to be analyzed */
){
  WhereInfo *pWInfo = pWC->pWInfo;        /* WHERE clause processing context */
  Parse *pParse = pWInfo->pParse;         /* Parser context */
  sqlite3 *db = pParse->db;               /* Database connection */
  WhereTerm *pTerm = &pWC->a[idxTerm];    /* The term to be analyzed */
  Expr *pExpr = pTerm->pExpr;             /* The expression of the term */
  int i;                                  /* Loop counters */
  WhereClause *pOrWc;       /* Breakup of pTerm into subterms */
  WhereTerm *pOrTerm;       /* A Sub-term within the pOrWc */
  WhereOrInfo *pOrInfo;     /* Additional information associated with pTerm */
  Bitmask chngToIN;         /* Tables that might satisfy case 1 */
  Bitmask indexable;        /* Tables that are indexable, satisfying case 2 */

  /*
  ** Break the OR clause into its separate subterms.  The subterms are
  ** stored in a WhereClause structure containing within the WhereOrInfo
  ** object that is attached to the original OR clause term.
  */
  assert( (pTerm->wtFlags & (TERM_DYNAMIC|TERM_ORINFO|TERM_ANDINFO))==0 );
  assert( pExpr->op==TK_OR );
  pTerm->u.pOrInfo = pOrInfo = sqlite3DbMallocZero(db, sizeof(*pOrInfo));
  if( pOrInfo==0 ) return;
  pTerm->wtFlags |= TERM_ORINFO;
  pOrWc = &pOrInfo->wc;
  memset(pOrWc->aStatic, 0, sizeof(pOrWc->aStatic));
  sqlite3WhereClauseInit(pOrWc, pWInfo);
  sqlite3WhereSplit(pOrWc, pExpr, TK_OR);
  sqlite3WhereExprAnalyze(pSrc, pOrWc);
  if( db->mallocFailed ) return;
  assert( pOrWc->nTerm>=2 );

  /*
  ** Compute the set of tables that might satisfy cases 1 or 3.
  */
  indexable = ~(Bitmask)0;
  chngToIN = ~(Bitmask)0;
  for(i=pOrWc->nTerm-1, pOrTerm=pOrWc->a; i>=0 && indexable; i--, pOrTerm++){
    if( (pOrTerm->eOperator & WO_SINGLE)==0 ){
      WhereAndInfo *pAndInfo;
      assert( (pOrTerm->wtFlags & (TERM_ANDINFO|TERM_ORINFO))==0 );
      chngToIN = 0;
      pAndInfo = sqlite3DbMallocRawNN(db, sizeof(*pAndInfo));
      if( pAndInfo ){
        WhereClause *pAndWC;
        WhereTerm *pAndTerm;
        int j;
        Bitmask b = 0;
        pOrTerm->u.pAndInfo = pAndInfo;
        pOrTerm->wtFlags |= TERM_ANDINFO;
        pOrTerm->eOperator = WO_AND;
        pAndWC = &pAndInfo->wc;
        memset(pAndWC->aStatic, 0, sizeof(pAndWC->aStatic));
        sqlite3WhereClauseInit(pAndWC, pWC->pWInfo);
        sqlite3WhereSplit(pAndWC, pOrTerm->pExpr, TK_AND);
        sqlite3WhereExprAnalyze(pSrc, pAndWC);
        pAndWC->pOuter = pWC;
        if( !db->mallocFailed ){
          for(j=0, pAndTerm=pAndWC->a; j<pAndWC->nTerm; j++, pAndTerm++){
            assert( pAndTerm->pExpr );
            if( allowedOp(pAndTerm->pExpr->op) 
             || pAndTerm->eOperator==WO_AUX
            ){
              b |= sqlite3WhereGetMask(&pWInfo->sMaskSet, pAndTerm->leftCursor);
            }
          }
        }
        indexable &= b;
      }
    }else if( pOrTerm->wtFlags & TERM_COPIED ){
      /* Skip this term for now.  We revisit it when we process the
      ** corresponding TERM_VIRTUAL term */
    }else{
      Bitmask b;
      b = sqlite3WhereGetMask(&pWInfo->sMaskSet, pOrTerm->leftCursor);
      if( pOrTerm->wtFlags & TERM_VIRTUAL ){
        WhereTerm *pOther = &pOrWc->a[pOrTerm->iParent];
        b |= sqlite3WhereGetMask(&pWInfo->sMaskSet, pOther->leftCursor);
      }
      indexable &= b;
      if( (pOrTerm->eOperator & WO_EQ)==0 ){
        chngToIN = 0;
      }else{
        chngToIN &= b;
      }
    }
  }

  /*
  ** Record the set of tables that satisfy case 3.  The set might be
  ** empty.
  */
  pOrInfo->indexable = indexable;
  if( indexable ){
    pTerm->eOperator = WO_OR;
    pWC->hasOr = 1;
  }else{
    pTerm->eOperator = WO_OR;
  }

  /* For a two-way OR, attempt to implementation case 2.
  */
  if( indexable && pOrWc->nTerm==2 ){
    int iOne = 0;
    WhereTerm *pOne;
    while( (pOne = whereNthSubterm(&pOrWc->a[0],iOne++))!=0 ){
      int iTwo = 0;
      WhereTerm *pTwo;
      while( (pTwo = whereNthSubterm(&pOrWc->a[1],iTwo++))!=0 ){
        whereCombineDisjuncts(pSrc, pWC, pOne, pTwo);
      }
    }
  }

  /*
  ** chngToIN holds a set of tables that *might* satisfy case 1.  But
  ** we have to do some additional checking to see if case 1 really
  ** is satisfied.
  **
  ** chngToIN will hold either 0, 1, or 2 bits.  The 0-bit case means
  ** that there is no possibility of transforming the OR clause into an
  ** IN operator because one or more terms in the OR clause contain
  ** something other than == on a column in the single table.  The 1-bit
  ** case means that every term of the OR clause is of the form
  ** "table.column=expr" for some single table.  The one bit that is set
  ** will correspond to the common table.  We still need to check to make
  ** sure the same column is used on all terms.  The 2-bit case is when
  ** the all terms are of the form "table1.column=table2.column".  It
  ** might be possible to form an IN operator with either table1.column
  ** or table2.column as the LHS if either is common to every term of
  ** the OR clause.
  **
  ** Note that terms of the form "table.column1=table.column2" (the
  ** same table on both sizes of the ==) cannot be optimized.
  */
  if( chngToIN ){
    int okToChngToIN = 0;     /* True if the conversion to IN is valid */
    int iColumn = -1;         /* Column index on lhs of IN operator */
    int iCursor = -1;         /* Table cursor common to all terms */
    int j = 0;                /* Loop counter */

    /* Search for a table and column that appears on one side or the
    ** other of the == operator in every subterm.  That table and column
    ** will be recorded in iCursor and iColumn.  There might not be any
    ** such table and column.  Set okToChngToIN if an appropriate table
    ** and column is found but leave okToChngToIN false if not found.
    */
    for(j=0; j<2 && !okToChngToIN; j++){
      Expr *pLeft = 0;
      pOrTerm = pOrWc->a;
      for(i=pOrWc->nTerm-1; i>=0; i--, pOrTerm++){
        assert( pOrTerm->eOperator & WO_EQ );
        pOrTerm->wtFlags &= ~TERM_OR_OK;
        if( pOrTerm->leftCursor==iCursor ){
          /* This is the 2-bit case and we are on the second iteration and
          ** current term is from the first iteration.  So skip this term. */
          assert( j==1 );
          continue;
        }
        if( (chngToIN & sqlite3WhereGetMask(&pWInfo->sMaskSet,
                                            pOrTerm->leftCursor))==0 ){
          /* This term must be of the form t1.a==t2.b where t2 is in the
          ** chngToIN set but t1 is not.  This term will be either preceded
          ** or follwed by an inverted copy (t2.b==t1.a).  Skip this term 
          ** and use its inversion. */
          testcase( pOrTerm->wtFlags & TERM_COPIED );
          testcase( pOrTerm->wtFlags & TERM_VIRTUAL );
          assert( pOrTerm->wtFlags & (TERM_COPIED|TERM_VIRTUAL) );
          continue;
        }
        iColumn = pOrTerm->u.leftColumn;
        iCursor = pOrTerm->leftCursor;
        pLeft = pOrTerm->pExpr->pLeft;
        break;
      }
      if( i<0 ){
        /* No candidate table+column was found.  This can only occur
        ** on the second iteration */
        assert( j==1 );
        assert( IsPowerOfTwo(chngToIN) );
        assert( chngToIN==sqlite3WhereGetMask(&pWInfo->sMaskSet, iCursor) );
        break;
      }
      testcase( j==1 );

      /* We have found a candidate table and column.  Check to see if that
      ** table and column is common to every term in the OR clause */
      okToChngToIN = 1;
      for(; i>=0 && okToChngToIN; i--, pOrTerm++){
        assert( pOrTerm->eOperator & WO_EQ );
        if( pOrTerm->leftCursor!=iCursor ){
          pOrTerm->wtFlags &= ~TERM_OR_OK;
        }else if( pOrTerm->u.leftColumn!=iColumn || (iColumn==XN_EXPR 
               && sqlite3ExprCompare(pParse, pOrTerm->pExpr->pLeft, pLeft, -1)
        )){
          okToChngToIN = 0;
        }else{
          int affLeft, affRight;
          /* If the right-hand side is also a column, then the affinities
          ** of both right and left sides must be such that no type
          ** conversions are required on the right.  (Ticket #2249)
          */
          affRight = sqlite3ExprAffinity(pOrTerm->pExpr->pRight);
          affLeft = sqlite3ExprAffinity(pOrTerm->pExpr->pLeft);
          if( affRight!=0 && affRight!=affLeft ){
            okToChngToIN = 0;
          }else{
            pOrTerm->wtFlags |= TERM_OR_OK;
          }
        }
      }
    }

    /* At this point, okToChngToIN is true if original pTerm satisfies
    ** case 1.  In that case, construct a new virtual term that is 
    ** pTerm converted into an IN operator.
    */
    if( okToChngToIN ){
      Expr *pDup;            /* A transient duplicate expression */
      ExprList *pList = 0;   /* The RHS of the IN operator */
      Expr *pLeft = 0;       /* The LHS of the IN operator */
      Expr *pNew;            /* The complete IN operator */

      for(i=pOrWc->nTerm-1, pOrTerm=pOrWc->a; i>=0; i--, pOrTerm++){
        if( (pOrTerm->wtFlags & TERM_OR_OK)==0 ) continue;
        assert( pOrTerm->eOperator & WO_EQ );
        assert( pOrTerm->leftCursor==iCursor );
        assert( pOrTerm->u.leftColumn==iColumn );
        pDup = sqlite3ExprDup(db, pOrTerm->pExpr->pRight, 0);
        pList = sqlite3ExprListAppend(pWInfo->pParse, pList, pDup);
        pLeft = pOrTerm->pExpr->pLeft;
      }
      assert( pLeft!=0 );
      pDup = sqlite3ExprDup(db, pLeft, 0);
      pNew = sqlite3PExpr(pParse, TK_IN, pDup, 0);
      if( pNew ){
        int idxNew;
        transferJoinMarkings(pNew, pExpr);
        assert( !ExprHasProperty(pNew, EP_xIsSelect) );
        pNew->x.pList = pList;
        idxNew = whereClauseInsert(pWC, pNew, TERM_VIRTUAL|TERM_DYNAMIC);
        testcase( idxNew==0 );
        exprAnalyze(pSrc, pWC, idxNew);
        /* pTerm = &pWC->a[idxTerm]; // would be needed if pTerm where used again */
        markTermAsChild(pWC, idxNew, idxTerm);
      }else{
        sqlite3ExprListDelete(db, pList);
      }
    }
  }
}